

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

BOOL LOADFreeLibrary(MODSTRUCT *module,BOOL fCallDllMain)

{
  _MODSTRUCT *p_Var1;
  _MODSTRUCT *p_Var2;
  BOOL BVar3;
  int iVar4;
  code *pcVar5;
  BOOL BVar6;
  
  LockModuleList();
  BVar6 = 1;
  if (terminator.m_val == 0) {
    BVar3 = LOADValidateModule(module);
    if (BVar3 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0012c5b4:
        abort();
      }
      SetLastError(6);
      BVar6 = 0;
    }
    else if (module->refcount != -1) {
      iVar4 = module->refcount + -1;
      module->refcount = iVar4;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c5b4;
      if (iVar4 == 0) {
        p_Var1 = module->next;
        p_Var2 = module->prev;
        p_Var2->next = p_Var1;
        p_Var1->prev = p_Var2;
        module->self = (HMODULE)0x0;
        if ((fCallDllMain != 0) && (module->pDllMain != (PDLLMAIN)0x0)) {
          LOADCallDllMainSafe(module,0,(LPVOID)0x0);
        }
        if (module->hinstance != (HINSTANCE)0x0) {
          pcVar5 = (code *)dlsym(module->dl_handle,"PAL_UnregisterModule");
          if (pcVar5 != (code *)0x0) {
            (*pcVar5)(module->hinstance);
          }
          module->hinstance = (HINSTANCE)0x0;
        }
        if (module->dl_handle != (void *)0x0) {
          iVar4 = dlclose();
          if (iVar4 != 0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c5b4;
            dlerror();
          }
        }
        CorUnix::InternalFree(module->lib_name);
        CorUnix::InternalFree(module);
      }
    }
  }
  UnlockModuleList();
  return BVar6;
}

Assistant:

static BOOL LOADFreeLibrary(MODSTRUCT *module, BOOL fCallDllMain)
{
    BOOL retval = FALSE;

    LockModuleList();

    if (terminator)
    {
        /* PAL shutdown is in progress - ignore FreeLibrary calls */
        retval = TRUE;
        goto done;
    }

    if (!LOADValidateModule(module))
    {
        TRACE("Can't free invalid module %p\n", module);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    if (module->refcount == -1)
    {
        /* special module - never released */
        retval = TRUE;
        goto done;
    }

    module->refcount--;
    TRACE("Reference count for module %p (named %S) decreases to %d\n",
            module, MODNAME(module), module->refcount);

    if (module->refcount != 0)
    {
        retval = TRUE;
        goto done;
    }

    /* Releasing the last reference : call dlclose(), remove module from the
       process-wide module list */

    TRACE("Reference count for module %p (named %S) now 0; destroying module structure\n",
        module, MODNAME(module));

    /* unlink the module structure from the list */
    module->prev->next = module->next;
    module->next->prev = module->prev;

    /* remove the circular reference so that LOADValidateModule will fail */
    module->self = nullptr;

    /* Call DllMain if the module contains one */
    if (fCallDllMain && module->pDllMain)
    {
        LOADCallDllMainSafe(module, DLL_PROCESS_DETACH, nullptr);
    }

    if (module->hinstance)
    {
        PUNREGISTER_MODULE unregisterModule = (PUNREGISTER_MODULE)dlsym(module->dl_handle, "PAL_UnregisterModule");
        if (unregisterModule != nullptr)
        {
             unregisterModule(module->hinstance);
        }
        module->hinstance = nullptr;
    }

    if (module->dl_handle && 0 != dlclose(module->dl_handle))
    {
        /* report dlclose() failure, but proceed anyway. */
        WARN("dlclose() call failed! error message is \"%s\"\n", dlerror());
    }

    /* release all memory */
    InternalFree(module->lib_name);
    InternalFree(module);

    retval = TRUE;

done:
    UnlockModuleList();
    return retval;
}